

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::InternalSwap
          (TreeEnsembleParameters_TreeNode *this,TreeEnsembleParameters_TreeNode *other)

{
  intptr_t iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  undefined3 uVar8;
  int iVar9;
  bool bVar10;
  undefined3 uVar11;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  google::protobuf::
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::
  InternalSwap(&this->evaluationinfo_,&other->evaluationinfo_);
  uVar2 = this->treeid_;
  uVar3 = this->nodeid_;
  uVar4 = other->nodeid_;
  this->treeid_ = other->treeid_;
  this->nodeid_ = uVar4;
  other->treeid_ = uVar2;
  other->nodeid_ = uVar3;
  iVar9 = this->nodebehavior_;
  bVar10 = this->missingvaluetrackstruechild_;
  uVar11 = *(undefined3 *)&this->field_0x3d;
  uVar2 = this->branchfeatureindex_;
  bVar7 = other->missingvaluetrackstruechild_;
  uVar8 = *(undefined3 *)&other->field_0x3d;
  uVar3 = other->branchfeatureindex_;
  this->nodebehavior_ = other->nodebehavior_;
  this->missingvaluetrackstruechild_ = bVar7;
  *(undefined3 *)&this->field_0x3d = uVar8;
  this->branchfeatureindex_ = uVar3;
  other->nodebehavior_ = iVar9;
  other->missingvaluetrackstruechild_ = bVar10;
  *(undefined3 *)&other->field_0x3d = uVar11;
  other->branchfeatureindex_ = uVar2;
  dVar5 = this->branchfeaturevalue_;
  uVar2 = this->truechildnodeid_;
  uVar3 = other->truechildnodeid_;
  this->branchfeaturevalue_ = other->branchfeaturevalue_;
  this->truechildnodeid_ = uVar3;
  other->branchfeaturevalue_ = dVar5;
  other->truechildnodeid_ = uVar2;
  uVar2 = this->falsechildnodeid_;
  dVar5 = this->relativehitrate_;
  dVar6 = other->relativehitrate_;
  this->falsechildnodeid_ = other->falsechildnodeid_;
  this->relativehitrate_ = dVar6;
  other->falsechildnodeid_ = uVar2;
  other->relativehitrate_ = dVar5;
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode::InternalSwap(TreeEnsembleParameters_TreeNode* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  evaluationinfo_.InternalSwap(&other->evaluationinfo_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(TreeEnsembleParameters_TreeNode, relativehitrate_)
      + sizeof(TreeEnsembleParameters_TreeNode::relativehitrate_)
      - PROTOBUF_FIELD_OFFSET(TreeEnsembleParameters_TreeNode, treeid_)>(
          reinterpret_cast<char*>(&treeid_),
          reinterpret_cast<char*>(&other->treeid_));
}